

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

jx9_io_stream * jx9VmGetStreamDevice(jx9_vm *pVm,char **pzDevice,int nByte)

{
  long lVar1;
  char cVar2;
  char *pcVar3;
  void *pvVar4;
  jx9_io_stream *pjVar5;
  char *zRight;
  char *pcVar6;
  int iVar7;
  ushort **ppuVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char *local_48;
  
  if (0 < nByte) {
    pcVar3 = *pzDevice;
    uVar12 = 0;
    do {
      if ((((pcVar3 + uVar12 < pcVar3 + nByte + -3) && (pcVar3[uVar12] == ':')) &&
          (pcVar3[uVar12 + 1] == '/')) && (pcVar3[uVar12 + 2] == '/')) {
        local_48 = pcVar3;
        if ((int)uVar12 == 0) {
          uVar11 = 0;
          goto LAB_0012d0ae;
        }
        uVar11 = uVar12 & 0xffffffff;
        goto LAB_0012d079;
      }
      lVar1 = uVar12 + 1;
      uVar12 = uVar12 + 1;
    } while (pcVar3 + lVar1 < pcVar3 + nByte);
  }
  return pVm->pDefStream;
  while( true ) {
    local_48 = local_48 + 1;
    uVar11 = (ulong)(uVar10 - 1);
    if (uVar10 - 1 == 0) break;
LAB_0012d079:
    uVar10 = (uint)uVar11;
    cVar2 = *local_48;
    if ((0xffffffffffffffbf < (ulong)(long)cVar2) ||
       (ppuVar8 = __ctype_b_loc(), (*(byte *)((long)*ppuVar8 + (long)cVar2 * 2 + 1) & 0x20) == 0))
    goto LAB_0012d0a2;
  }
  uVar10 = 0;
  local_48 = pcVar3 + (uVar12 - 1 & 0xffffffff) + 1;
LAB_0012d0a2:
  uVar11 = (ulong)uVar10;
LAB_0012d0ae:
  uVar10 = ~(uint)uVar11;
  do {
    if (uVar11 == 0) {
      uVar11 = 0;
      goto LAB_0012d0fb;
    }
    cVar2 = local_48[uVar11 - 1];
    if (0xffffffffffffffbf < (ulong)(long)cVar2) goto LAB_0012d0fb;
    ppuVar8 = __ctype_b_loc();
    uVar10 = uVar10 + 1;
    uVar11 = uVar11 - 1;
  } while ((*(byte *)((long)*ppuVar8 + (long)cVar2 * 2 + 1) & 0x20) != 0);
  uVar11 = (ulong)-uVar10;
LAB_0012d0fb:
  uVar13 = (ulong)(pVm->aIOstream).nUsed;
  if (uVar13 != 0) {
    pvVar4 = (pVm->aIOstream).pBase;
    uVar14 = 0;
    do {
      pjVar5 = *(jx9_io_stream **)((long)pvVar4 + uVar14 * 8);
      zRight = pjVar5->zName;
      pcVar9 = zRight;
      if (*zRight != '\0') {
        pcVar6 = zRight + 2;
        do {
          pcVar9 = pcVar6;
          if (pcVar9[-1] == '\0') {
            pcVar9 = pcVar9 + -1;
            goto LAB_0012d157;
          }
          if (*pcVar9 == '\0') goto LAB_0012d157;
          if (pcVar9[1] == '\0') {
            pcVar9 = pcVar9 + 1;
            goto LAB_0012d157;
          }
          pcVar6 = pcVar9 + 4;
        } while (pcVar9[2] != '\0');
        pcVar9 = pcVar9 + 2;
      }
LAB_0012d157:
      iVar7 = (sxu32)uVar11 - ((int)pcVar9 - (int)zRight);
      if (iVar7 == 0) {
        iVar7 = SyStrnicmp(local_48,zRight,(sxu32)uVar11);
      }
      if (iVar7 == 0) {
        *pzDevice = pcVar3 + uVar12 + 3;
        return pjVar5;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar13);
  }
  return (jx9_io_stream *)0x0;
}

Assistant:

JX9_PRIVATE const jx9_io_stream * jx9VmGetStreamDevice(
	jx9_vm *pVm,           /* Target VM */
	const char **pzDevice, /* Full path, URI, ... */
	int nByte              /* *pzDevice length*/
	)
{
	const char *zIn, *zEnd, *zCur, *zNext;
	jx9_io_stream **apStream, *pStream;
	SyString sDev, sCur;
	sxu32 n, nEntry;
	int rc;
	/* Check if a scheme [i.e: file://, http://, zip://...] is available */
	zNext = zCur = zIn = *pzDevice;
	zEnd = &zIn[nByte];
	while( zIn < zEnd ){
		if( zIn < &zEnd[-3]/*://*/ && zIn[0] == ':' && zIn[1] == '/' && zIn[2] == '/' ){
			/* Got one */
			zNext = &zIn[sizeof("://")-1];
			break;
		}
		/* Advance the cursor */
		zIn++;
	}
	if( zIn >= zEnd ){
		/* No such scheme, return the default stream */
		return pVm->pDefStream;
	}
	SyStringInitFromBuf(&sDev, zCur, zIn-zCur);
	/* Remove leading and trailing white spaces */
	SyStringFullTrim(&sDev);
	/* Perform a linear lookup on the installed stream devices */
	apStream = (jx9_io_stream **)SySetBasePtr(&pVm->aIOstream);
	nEntry = SySetUsed(&pVm->aIOstream);
	for( n = 0 ; n < nEntry ; n++ ){
		pStream = apStream[n];
		SyStringInitFromBuf(&sCur, pStream->zName, SyStrlen(pStream->zName));
		/* Perfrom a case-insensitive comparison */
		rc = SyStringCmp(&sDev, &sCur, SyStrnicmp);
		if( rc == 0 ){
			/* Stream device found */
			*pzDevice = zNext;
			return pStream;
		}
	}
	/* No such stream, return NULL */
	return 0;
}